

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<bool,_allocator_default<bool>_>::alloc
          (array<bool,_allocator_default<bool>_> *this,int new_len)

{
  bool *pbVar1;
  int iVar2;
  bool *pbVar3;
  ulong uVar4;
  
  this->list_size = new_len;
  pbVar3 = (bool *)operator_new__((long)new_len);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pbVar1 = this->list;
    uVar4 = 0;
    do {
      pbVar3[uVar4] = pbVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)new_len != uVar4);
  }
  if (this->list != (bool *)0x0) {
    operator_delete__(this->list);
  }
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pbVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}